

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

QCborValueConstRef __thiscall
QCborContainerPrivate::findCborMapKey<QLatin1String>(QCborContainerPrivate *this,QLatin1String key)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  QCborValueConstRef QVar4;
  
  if ((this->elements).d.size == 0) {
    uVar3 = 1;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      iVar1 = stringCompareElement<QLatin1String>
                        (this,(Element *)((long)&((this->elements).d.ptr)->field_0 + lVar2),key,
                         ForEquality);
      if (iVar1 == 0) break;
      uVar3 = uVar3 + 2;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)(this->elements).d.size);
    uVar3 = uVar3 | 1;
  }
  QVar4.i = uVar3;
  QVar4.d = this;
  return QVar4;
}

Assistant:

QCborValueConstRef findCborMapKey(KeyType key)
    {
        qsizetype i = 0;
        for ( ; i < elements.size(); i += 2) {
            const auto &e = elements.at(i);
            bool equals;
            if constexpr (std::is_same_v<std::decay_t<KeyType>, QCborValue>) {
                equals = (compareElement(i, key, QtCbor::Comparison::ForEquality) == 0);
            } else if constexpr (std::is_integral_v<KeyType>) {
                equals = (e.type == QCborValue::Integer && e.value == key);
            } else {
                // assume it's a string
                equals = stringEqualsElement(i, key);
            }
            if (equals)
                break;
        }
        return { this, i + 1 };
    }